

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrdrivr.c
# Opt level: O0

FT_Error pfr_get_kerning(FT_Face pfrface,FT_UInt left,FT_UInt right,FT_Vector *avector)

{
  FT_Long FVar1;
  PFR_PhyFont phys;
  PFR_Face face;
  FT_Vector *avector_local;
  FT_UInt right_local;
  FT_UInt left_local;
  FT_Face pfrface_local;
  
  pfr_face_get_kerning(pfrface,left,right,avector);
  if (*(int *)&pfrface[1].driver != *(int *)((long)&pfrface[1].driver + 4)) {
    if (avector->x != 0) {
      FVar1 = FT_MulDiv(avector->x,(ulong)*(uint *)&pfrface[1].driver,
                        (ulong)*(uint *)((long)&pfrface[1].driver + 4));
      avector->x = FVar1;
    }
    if (avector->y != 0) {
      FVar1 = FT_MulDiv(avector->y,(ulong)*(uint *)&pfrface[1].driver,
                        (ulong)*(uint *)((long)&pfrface[1].driver + 4));
      avector->y = FVar1;
    }
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  pfr_get_kerning( FT_Face     pfrface,     /* PFR_Face */
                   FT_UInt     left,
                   FT_UInt     right,
                   FT_Vector  *avector )
  {
    PFR_Face     face = (PFR_Face)pfrface;
    PFR_PhyFont  phys = &face->phy_font;


    (void)pfr_face_get_kerning( pfrface, left, right, avector );

    /* convert from metrics to outline units when necessary */
    if ( phys->outline_resolution != phys->metrics_resolution )
    {
      if ( avector->x != 0 )
        avector->x = FT_MulDiv( avector->x,
                                (FT_Long)phys->outline_resolution,
                                (FT_Long)phys->metrics_resolution );

      if ( avector->y != 0 )
        avector->y = FT_MulDiv( avector->y,
                                (FT_Long)phys->outline_resolution,
                                (FT_Long)phys->metrics_resolution );
    }

    return FT_Err_Ok;
  }